

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SPFForceManager.cpp
# Opt level: O3

void __thiscall OpenMD::RNEMD::SPFForceManager::updateExcludedPotentials(SPFForceManager *this)

{
  potVec excludedPotentials;
  potVec local_108;
  potVec local_c8;
  potVec local_90;
  Vector<double,_7U> local_58;
  
  Snapshot::getExcludedPotentials(&local_90,this->temporarySourceSnapshot_);
  Snapshot::getExcludedPotentials(&local_c8,this->temporarySinkSnapshot_);
  linearCombination<OpenMD::Vector<double,7u>>(&local_58,this,&local_90,&local_c8);
  local_108.data_[6] = local_58.data_[6];
  local_108.data_[4] = local_58.data_[4];
  local_108.data_[5] = local_58.data_[5];
  local_108.data_[2] = local_58.data_[2];
  local_108.data_[3] = local_58.data_[3];
  local_108.data_[0] = local_58.data_[0];
  local_108.data_[1] = local_58.data_[1];
  Snapshot::setExcludedPotentials(this->currentSnapshot_,&local_108);
  return;
}

Assistant:

void SPFForceManager::updateExcludedPotentials() {
    potVec excludedPotentials =
        linearCombination(temporarySourceSnapshot_->getExcludedPotentials(),
                          temporarySinkSnapshot_->getExcludedPotentials());
    currentSnapshot_->setExcludedPotentials(excludedPotentials);
  }